

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TypeTree.h
# Opt level: O0

void __thiscall
TypeArgumentSet::TypeArgumentSet
          (TypeArgumentSet *this,InplaceStr name,IntrusiveList<TypeHandle> types)

{
  TypeArgumentSet *this_local;
  IntrusiveList<TypeHandle> types_local;
  InplaceStr name_local;
  
  TypeBase::TypeBase(&this->super_TypeBase,0x1b,name);
  (this->super_TypeBase)._vptr_TypeBase = (_func_int **)&PTR__TypeArgumentSet_002d22d8;
  (this->types).head = types.head;
  (this->types).tail = types.tail;
  (this->super_TypeBase).isGeneric = true;
  return;
}

Assistant:

TypeArgumentSet(InplaceStr name, IntrusiveList<TypeHandle> types): TypeBase(myTypeID, name), types(types)
	{
		isGeneric = true;
	}